

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable_binary.hpp
# Opt level: O3

void __thiscall
cereal::PortableBinaryInputArchive::loadBinary<8ul>
          (PortableBinaryInputArchive *this,void *data,size_t size)

{
  undefined1 uVar1;
  unsigned_long __val;
  undefined1 *puVar2;
  runtime_error *this_00;
  long *plVar3;
  ulong uVar4;
  size_type *psVar5;
  undefined1 *puVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __val = (**(code **)(**(long **)(this->itsStream +
                                  *(long *)(*(long *)this->itsStream + -0x18) + 0xe8) + 0x40))();
  if (__val == size) {
    if (size != 0 && this->itsConvertEndianness != '\0') {
      puVar2 = (undefined1 *)((long)data + 7);
      uVar4 = 0;
      do {
        lVar7 = 0;
        puVar6 = puVar2;
        do {
          uVar1 = *(undefined1 *)((long)data + lVar7);
          *(undefined1 *)((long)data + lVar7) = *puVar6;
          *puVar6 = uVar1;
          lVar7 = lVar7 + 1;
          puVar6 = puVar6 + -1;
        } while (lVar7 != 4);
        uVar4 = uVar4 + 8;
        puVar2 = puVar2 + 8;
        data = (void *)((long)data + 8);
      } while (uVar4 < size);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_a8,size);
  std::operator+(&local_68,"Failed to read ",&local_a8);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_c8._M_dataplus._M_p = (pointer)*plVar3;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_c8._M_dataplus._M_p == psVar5) {
    local_c8.field_2._M_allocated_capacity = *psVar5;
    local_c8.field_2._8_8_ = plVar3[3];
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  }
  else {
    local_c8.field_2._M_allocated_capacity = *psVar5;
  }
  local_c8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::to_string(&local_88,__val);
  std::operator+(&local_48,&local_c8,&local_88);
  std::runtime_error::runtime_error(this_00,(string *)&local_48);
  *(undefined ***)this_00 = &PTR__runtime_error_003ebfa0;
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
      void loadBinary( void * const data, std::size_t size )
      {
        // load data
        auto const readSize = static_cast<std::size_t>( itsStream.rdbuf()->sgetn( reinterpret_cast<char*>( data ), size ) );

        if(readSize != size)
          throw Exception("Failed to read " + std::to_string(size) + " bytes from input stream! Read " + std::to_string(readSize));

        // flip bits if needed
        if( itsConvertEndianness )
        {
          std::uint8_t * ptr = reinterpret_cast<std::uint8_t*>( data );
          for( std::size_t i = 0; i < size; i += DataSize )
            portable_binary_detail::swap_bytes<DataSize>( ptr + i );
        }
      }